

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 HashmapInsertBlobKey(jx9_hashmap *pMap,void *pKey,sxu32 nKeyLen,jx9_value *pValue)

{
  jx9_vm *pjVar1;
  sxu32 sVar2;
  sxi32 sVar3;
  undefined8 in_RAX;
  jx9_value *pDest;
  jx9_hashmap_node *pNode;
  sxu32 nIdx;
  
  nIdx = (sxu32)((ulong)in_RAX >> 0x20);
  pDest = jx9VmReserveMemObj(pMap->pVm,&nIdx);
  sVar3 = -1;
  if (pDest != (jx9_value *)0x0) {
    if (pValue != (jx9_value *)0x0) {
      jx9MemObjStore(pValue,pDest);
    }
    sVar2 = (*pMap->xBlobHash)(pKey,nKeyLen);
    pNode = (jx9_hashmap_node *)SyMemBackendPoolAlloc(&pMap->pVm->sAllocator,0x60);
    if (pNode != (jx9_hashmap_node *)0x0) {
      SyZero(pNode,0x60);
      pNode->pMap = pMap;
      pNode->iType = 2;
      pNode->nHash = sVar2;
      pjVar1 = pMap->pVm;
      (pNode->xKey).sKey.pBlob = (void *)0x0;
      *(undefined8 *)((long)&pNode->xKey + 0x10) = 0;
      (pNode->xKey).iKey = (sxi64)pjVar1;
      (pNode->xKey).sKey.nFlags = 0;
      SyBlobAppend(&(pNode->xKey).sKey,pKey,nKeyLen);
      pNode->nValIdx = nIdx;
      sVar3 = HashmapGrowBucket(pMap);
      if (sVar3 == 0) {
        HashmapNodeLink(pMap,pNode,pMap->nSize - 1 & sVar2);
        sVar3 = 0;
      }
      else {
        SyMemBackendPoolFree(&pMap->pVm->sAllocator,pNode);
      }
    }
  }
  return sVar3;
}

Assistant:

static sxi32 HashmapInsertBlobKey(jx9_hashmap *pMap,const void *pKey,sxu32 nKeyLen,jx9_value *pValue)
{
	jx9_hashmap_node *pNode;
	jx9_value *pObj;
	sxu32 nHash;
	sxu32 nIdx;
	sxi32 rc;
	/* Reserve a jx9_value for the value */
	pObj = jx9VmReserveMemObj(pMap->pVm,&nIdx);
	if( pObj == 0 ){
		return SXERR_MEM;
	}
	if( pValue ){
		/* Duplicate the value */
		jx9MemObjStore(pValue, pObj);
	}
	/* Hash the key */
	nHash = pMap->xBlobHash(pKey, nKeyLen);
	/* Allocate a new blob node */
	pNode = HashmapNewBlobNode(&(*pMap), pKey, nKeyLen, nHash, nIdx);
	if( pNode == 0 ){
		return SXERR_MEM;
	}
	/* Make sure the bucket is big enough to hold the new entry */
	rc = HashmapGrowBucket(&(*pMap));
	if( rc != SXRET_OK ){
		SyMemBackendPoolFree(&pMap->pVm->sAllocator, pNode);
		return rc;
	}
	/* Perform the insertion */
	HashmapNodeLink(&(*pMap), pNode, nHash & (pMap->nSize - 1));
	/* All done */
	return SXRET_OK;
}